

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_gej_eq_var(secp256k1_gej *a,secp256k1_gej *b)

{
  secp256k1_gej tmp;
  secp256k1_gej local_90;
  
  secp256k1_gej_neg(&local_90,a);
  secp256k1_gej_add_var(&local_90,&local_90,b,(secp256k1_fe *)0x0);
  return local_90.infinity;
}

Assistant:

static int secp256k1_gej_eq_var(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej tmp;
    SECP256K1_GEJ_VERIFY(b);
    SECP256K1_GEJ_VERIFY(a);

    secp256k1_gej_neg(&tmp, a);
    secp256k1_gej_add_var(&tmp, &tmp, b, NULL);
    return secp256k1_gej_is_infinity(&tmp);
}